

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::TryGenerateFastCmSrXx(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  char *this_00;
  Lowerer *opnd;
  RegOpnd *opnd_00;
  
  OVar2 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar2 == OpndKindReg) {
    opnd_00 = (RegOpnd *)instr->m_src1;
    OVar2 = IR::Opnd::GetKind((Opnd *)opnd_00);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005c914e;
      *puVar4 = 0;
    }
  }
  else {
    opnd_00 = (RegOpnd *)0x0;
  }
  this_00 = (char *)instr->m_src2;
  OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar2 == OpndKindReg) {
    opnd = (Lowerer *)instr->m_src2;
    this_00 = (char *)opnd;
    OVar2 = IR::Opnd::GetKind((Opnd *)opnd);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      this_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
      ;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_005c914e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    opnd = (Lowerer *)0x0;
  }
  if (opnd != (Lowerer *)0x0) {
    bVar3 = IsConstRegOpnd((Lowerer *)this_00,(RegOpnd *)opnd);
    if (bVar3) goto LAB_005c9120;
  }
  if (opnd_00 != (RegOpnd *)0x0) {
    bVar3 = IsConstRegOpnd((Lowerer *)this_00,opnd_00);
    if (bVar3) {
      IR::Instr::SwapOpnds(instr);
LAB_005c9120:
      bVar3 = LowererMD::GenerateFastCmSrXxConst(&this->m_lowererMD,instr);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool
Lowerer::TryGenerateFastCmSrXx(IR::Instr * instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    if (srcReg2 && IsConstRegOpnd(srcReg2))
    {
        return m_lowererMD.GenerateFastCmSrXxConst(instr);
    }
    else if (srcReg1 && IsConstRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        return m_lowererMD.GenerateFastCmSrXxConst(instr);
    }

    return false;
}